

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

Var Js::JavascriptObject::DefinePropertiesHelperForGenericObjects
              (RecyclableObject *object,RecyclableObject *props,ScriptContext *scriptContext)

{
  undefined8 uVar1;
  code *pcVar2;
  Type TVar3;
  DescriptorMap *pDVar4;
  bool bVar5;
  int iVar6;
  BOOL BVar7;
  Recycler *pRVar8;
  JavascriptString *propertyString;
  undefined4 *puVar9;
  DescriptorMap *pDVar10;
  Var propertySpec;
  size_t count;
  size_t count_00;
  PropertyRecord *pPVar11;
  PropertyRecord *pPVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  Type *addr;
  undefined1 auStack_f8 [8];
  JavascriptStaticEnumerator enumerator;
  TrackAllocData data;
  Type local_50;
  PropertyRecord *propertyRecord;
  DescriptorMap *local_40;
  DescriptorMap *descriptors;
  PropertyId propId;
  
  auStack_f8 = (undefined1  [8])0x0;
  enumerator.propertyEnumerator.scriptContext.ptr = (ScriptContext *)0x0;
  enumerator.propertyEnumerator.object.ptr = (DynamicObject *)0x0;
  enumerator.propertyEnumerator.enumeratedCount = 0;
  enumerator.propertyEnumerator.flags = None;
  enumerator.propertyEnumerator._37_3_ = 0;
  enumerator.propertyEnumerator.cachedData.ptr = (CachedData *)0x0;
  enumerator.currentEnumerator.ptr = (JavascriptEnumerator *)0x0;
  enumerator.prefixEnumerator.ptr = (JavascriptEnumerator *)0x0;
  JavascriptStaticEnumerator::Clear
            ((JavascriptStaticEnumerator *)auStack_f8,None,(ScriptContext *)0x0);
  iVar6 = (*(props->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x2b])
                    (props,(JavascriptStaticEnumerator *)auStack_f8,2,scriptContext,0);
  if (iVar6 != 0) {
    EnterPinnedScope(&local_40);
    enumerator.arrayEnumerator.ptr =
         (JavascriptEnumerator *)
         &DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)
          ::DescriptorMap::typeinfo;
    pRVar8 = Memory::Recycler::TrackAllocInfo
                       (scriptContext->recycler,(TrackAllocData *)&enumerator.arrayEnumerator);
    pPVar12 = (PropertyRecord *)&DAT_00000010;
    local_40 = Memory::
               AllocateArray<Memory::Recycler,Js::JavascriptObject::DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)::DescriptorMap,false>
                         (pRVar8,0x10,count);
    propertyString =
         JavascriptStaticEnumerator::MoveAndGetNext
                   ((JavascriptStaticEnumerator *)auStack_f8,(PropertyId *)((long)&descriptors + 4),
                    (PropertyAttributes *)0x0);
    if (propertyString != (JavascriptString *)0x0) {
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      propertyRecord = (PropertyRecord *)0x0;
      lVar13 = 1;
      do {
        lVar14 = lVar13;
        if (descriptors._4_4_ == -1) {
          ScriptContext::GetOrAddPropertyRecord(scriptContext,propertyString,&local_50.ptr);
          descriptors._4_4_ = (local_50.ptr)->pid;
        }
        else {
          (*(propertyString->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x61])
                    (propertyString,&local_50,0);
        }
        pPVar11 = pPVar12;
        pDVar10 = local_40;
        if (propertyRecord == pPVar12) {
          pPVar11 = (PropertyRecord *)((long)pPVar12 * 2);
          if ((long)pPVar12 < 0) {
            pPVar11 = (PropertyRecord *)&DAT_ffffffffffffffff;
          }
          enumerator.arrayEnumerator.ptr =
               (JavascriptEnumerator *)
               &DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)
                ::DescriptorMap::typeinfo;
          pRVar8 = Memory::Recycler::TrackAllocInfo
                             (scriptContext->recycler,(TrackAllocData *)&enumerator.arrayEnumerator)
          ;
          pDVar10 = Memory::
                    AllocateArray<Memory::Recycler,Js::JavascriptObject::DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)::DescriptorMap,false>
                              (pRVar8,(AllocFuncType)pPVar11,count_00);
          if (pPVar12 != (PropertyRecord *)0x0) {
            lVar13 = 0;
            do {
              pDVar4 = local_40;
              pcVar15 = (char *)((long)&(pDVar10->propRecord).ptr + lVar13);
              uVar1 = *(undefined8 *)((long)&(local_40->propRecord).ptr + lVar13);
              Memory::Recycler::WBSetBit(pcVar15);
              *(undefined8 *)((long)&(pDVar10->propRecord).ptr + lVar13) = uVar1;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar15);
              pcVar15 = (char *)((long)&(pDVar10->descriptor).Value.ptr + lVar13);
              uVar1 = *(undefined8 *)((long)&(pDVar4->descriptor).Value.ptr + lVar13);
              Memory::Recycler::WBSetBit(pcVar15);
              *(undefined8 *)((long)&(pDVar10->descriptor).Value.ptr + lVar13) = uVar1;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar15);
              pcVar15 = (char *)((long)&(pDVar10->descriptor).Getter.ptr + lVar13);
              uVar1 = *(undefined8 *)((long)&(pDVar4->descriptor).Getter.ptr + lVar13);
              Memory::Recycler::WBSetBit(pcVar15);
              *(undefined8 *)((long)&(pDVar10->descriptor).Getter.ptr + lVar13) = uVar1;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar15);
              pcVar15 = (char *)((long)&(pDVar10->descriptor).Setter.ptr + lVar13);
              uVar1 = *(undefined8 *)((long)&(pDVar4->descriptor).Setter.ptr + lVar13);
              Memory::Recycler::WBSetBit(pcVar15);
              *(undefined8 *)((long)&(pDVar10->descriptor).Setter.ptr + lVar13) = uVar1;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar15);
              pcVar15 = (char *)((long)&(pDVar10->descriptor).originalVar.ptr + lVar13);
              uVar1 = *(undefined8 *)((long)&(pDVar4->descriptor).originalVar.ptr + lVar13);
              Memory::Recycler::WBSetBit(pcVar15);
              *(undefined8 *)((long)&(pDVar10->descriptor).originalVar.ptr + lVar13) = uVar1;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar15);
              *(undefined2 *)(&(pDVar10->descriptor).Configurable + lVar13) =
                   *(undefined2 *)(&(pDVar4->descriptor).Configurable + lVar13);
              *(undefined8 *)(&(pDVar10->descriptor).writableSpecified + lVar13) =
                   *(undefined8 *)(&(pDVar4->descriptor).writableSpecified + lVar13);
              pcVar15 = (char *)((long)&(pDVar10->originalVar).ptr + lVar13);
              uVar1 = *(undefined8 *)((long)&(pDVar4->originalVar).ptr + lVar13);
              Memory::Recycler::WBSetBit(pcVar15);
              *(undefined8 *)((long)&(pDVar10->originalVar).ptr + lVar13) = uVar1;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar15);
              lVar13 = lVar13 + 0x40;
              pPVar12 = (PropertyRecord *)((long)&pPVar12[-1].byteCount + 3);
            } while (pPVar12 != (PropertyRecord *)0x0);
          }
        }
        local_40 = pDVar10;
        pPVar12 = pPVar11;
        propertySpec = JavascriptOperators::GetPropertyNoCache
                                 (props,descriptors._4_4_,scriptContext);
        if (pPVar12 <= propertyRecord) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                      ,0x798,"(descCount < descSize)","descCount < descSize");
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar9 = 0;
        }
        pPVar11 = propertyRecord;
        BVar7 = JavascriptOperators::ToPropertyDescriptor
                          (propertySpec,&local_40[(long)propertyRecord].descriptor,scriptContext);
        if (BVar7 == 0) {
          pPVar12 = ScriptContext::GetPropertyName(scriptContext,descriptors._4_4_);
          JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec2c,(PCWSTR)(pPVar12 + 1));
        }
        addr = &local_40[(long)pPVar11].originalVar;
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = propertySpec;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        if (DAT_015bc46b == '\x01') {
          ModifyGetterSetterFuncName(local_50.ptr,&local_40[(long)pPVar11].descriptor,scriptContext)
          ;
        }
        pDVar4 = local_40;
        TVar3.ptr = local_50.ptr;
        pDVar10 = local_40 + (long)pPVar11;
        Memory::Recycler::WBSetBit((char *)pDVar10);
        pDVar4[(long)pPVar11].propRecord.ptr = TVar3.ptr;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pDVar10);
        propertyRecord =
             (PropertyRecord *)
             ((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject + 1);
        propertyString =
             JavascriptStaticEnumerator::MoveAndGetNext
                       ((JavascriptStaticEnumerator *)auStack_f8,
                        (PropertyId *)((long)&descriptors + 4),(PropertyAttributes *)0x0);
        lVar13 = lVar14 + 1;
      } while (propertyString != (JavascriptString *)0x0);
      if (propertyRecord != (PropertyRecord *)0x0) {
        lVar13 = 8;
        do {
          DefineOwnPropertyHelper
                    (object,*(PropertyId *)(*(long *)((long)local_40 + lVar13 + -8) + 8),
                     (PropertyDescriptor *)((long)&(local_40->propRecord).ptr + lVar13),
                     scriptContext,true);
          lVar13 = lVar13 + 0x40;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
    }
    LeavePinnedScope();
  }
  return object;
}

Assistant:

Var JavascriptObject::DefinePropertiesHelperForGenericObjects(RecyclableObject *object, RecyclableObject* props, ScriptContext *scriptContext)
{
    size_t descSize = 16;
    size_t descCount = 0;
    struct DescriptorMap
    {
        Field(PropertyRecord const *) propRecord;
        Field(PropertyDescriptor) descriptor;
        Field(Var) originalVar;
    };

    JavascriptStaticEnumerator enumerator;
    if (!props->GetEnumerator(&enumerator, EnumeratorFlags::EnumSymbols, scriptContext))
    {
        return object;
    }

    ENTER_PINNED_SCOPE(DescriptorMap, descriptors);
    descriptors = RecyclerNewArray(scriptContext->GetRecycler(), DescriptorMap, descSize);

    PropertyId propId;
    PropertyRecord const * propertyRecord;
    JavascriptString* propertyName = nullptr;

    //enumerate through each property of properties and fetch the property descriptor
    while ((propertyName = enumerator.MoveAndGetNext(propId)) != NULL)
    {
        if (propId == Constants::NoProperty) //try current property id query first
        {
            scriptContext->GetOrAddPropertyRecord(propertyName, &propertyRecord);
            propId = propertyRecord->GetPropertyId();
        }
        else
        {
            propertyName->GetPropertyRecord(&propertyRecord);
        }

        if (descCount == descSize)
        {
            //reallocate - consider linked list of DescriptorMap if the descSize is too high
            descSize = AllocSizeMath::Mul(descCount, 2);
            __analysis_assume(descSize == descCount * 2);
            DescriptorMap *temp = RecyclerNewArray(scriptContext->GetRecycler(), DescriptorMap, descSize);

            for (size_t i = 0; i < descCount; i++)
            {
                temp[i] = descriptors[i];
            }
            descriptors = temp;
        }

        Var tempVar = JavascriptOperators::GetPropertyNoCache(props, propId, scriptContext);

        AnalysisAssert(descCount < descSize);
        if (!JavascriptOperators::ToPropertyDescriptor(tempVar, &descriptors[descCount].descriptor, scriptContext))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_PropertyDescriptor_Invalid, scriptContext->GetPropertyName(propId)->GetBuffer());
        }
        // In proxy, we need to get back the original ToPropertDescriptor var in [[defineProperty]] trap.
        descriptors[descCount].originalVar = tempVar;

        if (CONFIG_FLAG(UseFullName))
        {
            ModifyGetterSetterFuncName(propertyRecord, descriptors[descCount].descriptor, scriptContext);
        }

        descriptors[descCount].propRecord = propertyRecord;

        descCount++;
    }

    //Once all the property descriptors are in place set each property descriptor to the object
    for (size_t i = 0; i < descCount; i++)
    {
        DefineOwnPropertyHelper(object, descriptors[i].propRecord->GetPropertyId(), descriptors[i].descriptor, scriptContext);
    }

    LEAVE_PINNED_SCOPE();

    return object;
}